

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSolve.c
# Opt level: O3

DdNode * cuddVerifySol(DdManager *bdd,DdNode *F,DdNode **G,int *yIndex,int n)

{
  DdNode *f;
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)F & 0xfffffffffffffffe;
  *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + 1;
  if (0 < n) {
    uVar1 = (ulong)(uint)n + 1;
    f = F;
    do {
      F = Cudd_bddCompose(bdd,f,G[uVar1 - 2],yIndex[uVar1 - 2]);
      if (F == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      uVar2 = (ulong)F & 0xfffffffffffffffe;
      *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + 1;
      Cudd_RecursiveDeref(bdd,f);
      uVar1 = uVar1 - 1;
      f = F;
    } while (1 < uVar1);
  }
  *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + -1;
  return F;
}

Assistant:

DdNode *
cuddVerifySol(
  DdManager * bdd,
  DdNode * F /* the left-hand side of the equation */,
  DdNode ** G /* the array of solutions */,
  int * yIndex /* array holding the y variable indices */,
  int  n /* number of unknowns */)
{
    DdNode *w, *R;

    int j;

    R = F;
    cuddRef(R);
    for(j = n - 1; j >= 0; j--) {
         w = Cudd_bddCompose(bdd, R, G[j], yIndex[j]);
        if (w) {
            cuddRef(w);
        } else {
            return(NULL); 
        }
        Cudd_RecursiveDeref(bdd,R);
        R = w;
    }

    cuddDeref(R);

    return(R);

}